

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonotope.cpp
# Opt level: O0

uint readFile(char *filename,
             vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *star)

{
  allocator<double> *this;
  value_type vVar1;
  byte bVar2;
  bool bVar3;
  istream *piVar4;
  size_type sVar5;
  reference pvVar6;
  Scalar *pSVar7;
  uint local_444;
  undefined1 local_440 [4];
  uint i;
  VectorXd v;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_428;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_410;
  undefined1 local_3f8 [8];
  vector<double,_std::allocator<double>_> line;
  istringstream buffer;
  uint local_25c;
  string local_258 [4];
  uint dim;
  string linestr;
  istream local_228 [8];
  ifstream input;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *star_local;
  char *filename_local;
  
  std::ifstream::ifstream(local_228,filename,8);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    printf("Could not open or find file: %s\n",filename);
    filename_local._4_4_ = 0;
  }
  else {
    std::__cxx11::string::string(local_258);
    local_25c = 0;
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,local_258);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,local_258);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,local_258);
    do {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,local_258);
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar3) {
        std::ifstream::close();
        filename_local._4_4_ = local_25c;
        break;
      }
      std::__cxx11::istringstream::istringstream
                ((istringstream *)
                 &line.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_258,8);
      std::istream_iterator<double,_char,_std::char_traits<char>,_long>::istream_iterator
                (&local_410,
                 (istream_type *)
                 &line.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::istream_iterator<double,_char,_std::char_traits<char>,_long>::istream_iterator
                (&local_428);
      this = (allocator<double> *)
             ((long)&v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows + 7);
      std::allocator<double>::allocator(this);
      std::vector<double,std::allocator<double>>::
      vector<std::istream_iterator<double,char,std::char_traits<char>,long>,void>
                ((vector<double,std::allocator<double>> *)local_3f8,&local_410,&local_428,this);
      std::allocator<double>::~allocator
                ((allocator<double> *)
                 ((long)&v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_rows + 7));
      sVar5 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_3f8);
      if ((sVar5 == 0) ||
         ((local_25c != 0 &&
          (sVar5 = std::vector<double,_std::allocator<double>_>::size
                             ((vector<double,_std::allocator<double>_> *)local_3f8),
          local_25c != sVar5)))) {
        printf("Malformed input file\n");
        std::ifstream::close();
        filename_local._4_4_ = 0;
        bVar3 = true;
      }
      else {
        sVar5 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)local_3f8);
        local_25c = (uint)sVar5;
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                  ((Matrix<double,__1,_1,_0,__1,_1> *)local_440,sVar5 & 0xffffffff);
        for (local_444 = 0; local_444 < local_25c; local_444 = local_444 + 1) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::at
                             ((vector<double,_std::allocator<double>_> *)local_3f8,(ulong)local_444)
          ;
          vVar1 = *pvVar6;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              local_440,(ulong)local_444);
          *pSVar7 = vVar1;
        }
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back(star,(value_type *)local_440);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                  ((Matrix<double,__1,_1,_0,__1,_1> *)local_440);
        bVar3 = false;
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_3f8);
      std::__cxx11::istringstream::~istringstream
                ((istringstream *)
                 &line.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    } while (!bVar3);
    std::__cxx11::string::~string(local_258);
  }
  std::ifstream::~ifstream(local_228);
  return filename_local._4_4_;
}

Assistant:

unsigned int readFile(const char *filename, std::vector<Eigen::VectorXd> &star) {
	std::ifstream input(filename);

	if (!input.is_open()) {
		printf("Could not open or find file: %s\n", filename);
		return 0;
	}

	std::string linestr;
	unsigned int dim = 0;

	// skipping first 3 lines
	std::getline(input, linestr);
	std::getline(input, linestr);
	std::getline(input, linestr);

	while (std::getline(input, linestr)) {
		std::istringstream buffer(linestr);
		std::vector<double> line((std::istream_iterator<double>(buffer)), std::istream_iterator<double>());

		if ((line.size() < 1) || (dim && dim != line.size())) {
			printf("Malformed input file\n");
			input.close();
			return 0;
		}

		dim = (unsigned int)(line.size());
		Eigen::VectorXd v(dim);

		for (unsigned int i = 0; i < dim; i++)
			v[i] = line.at(i);

		star.push_back(v);
	}

	input.close();

	return dim;
}